

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O2

int typed_array_init(JSContext *ctx,JSValue obj,JSValue buffer,uint64_t offset,uint64_t len)

{
  byte bVar1;
  long lVar2;
  long lVar3;
  int iVar4;
  long *plVar5;
  JSValueUnion JVar6;
  JSValueUnion JVar7;
  JSValue v;
  
  JVar6 = (JSValueUnion)obj.tag;
  JVar7 = obj.u;
  bVar1 = "includes"[(ulong)*(ushort *)((long)JVar7.ptr + 6) + 1];
  plVar5 = (long *)js_malloc(ctx,0x28);
  if (plVar5 == (long *)0x0) {
    v.tag = (int64_t)buffer.u.ptr;
    v.u.ptr = JVar6.ptr;
    JS_FreeValue(ctx,v);
    iVar4 = -1;
  }
  else {
    lVar2 = *(long *)((long)JVar6.ptr + 0x30);
    ((JSValueUnion *)(plVar5 + 2))->ptr = (void *)JVar7;
    ((JSValueUnion *)(plVar5 + 3))->ptr = (void *)JVar6;
    *(int *)(plVar5 + 4) = (int)buffer.tag;
    *(int *)((long)plVar5 + 0x24) = (int)(offset << (bVar1 & 0x3f));
    lVar3 = *(long *)(lVar2 + 0x10);
    *(long **)(lVar3 + 8) = plVar5;
    *plVar5 = lVar3;
    plVar5[1] = lVar2 + 0x10;
    *(long **)(lVar2 + 0x10) = plVar5;
    *(long **)((long)JVar7.ptr + 0x30) = plVar5;
    *(int *)((long)JVar7.ptr + 0x40) = (int)offset;
    *(int64_t *)((long)JVar7.ptr + 0x38) = buffer.tag + *(long *)(lVar2 + 8);
    iVar4 = 0;
  }
  return iVar4;
}

Assistant:

static int typed_array_init(JSContext *ctx, JSValueConst obj,
                            JSValue buffer, uint64_t offset, uint64_t len)
{
    JSTypedArray *ta;
    JSObject *p, *pbuffer;
    JSArrayBuffer *abuf;
    int size_log2;

    p = JS_VALUE_GET_OBJ(obj);
    size_log2 = typed_array_size_log2(p->class_id);
    ta = js_malloc(ctx, sizeof(*ta));
    if (!ta) {
        JS_FreeValue(ctx, buffer);
        return -1;
    }
    pbuffer = JS_VALUE_GET_OBJ(buffer);
    abuf = pbuffer->u.array_buffer;
    ta->obj = p;
    ta->buffer = pbuffer;
    ta->offset = offset;
    ta->length = len << size_log2;
    list_add_tail(&ta->link, &abuf->array_list);
    p->u.typed_array = ta;
    p->u.array.count = len;
    p->u.array.u.ptr = abuf->data + offset;
    return 0;
}